

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O0

void __thiscall
nonsugar::detail::parse_flag_short<std::__cxx11::string,int,void>::operator()
          (parse_flag_short<std::__cxx11::string,int,void> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              last,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *arg_it,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          arg_last,shared_ptr<int> *value,
          flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_int>
          *flg,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *err)

{
  bool bVar1;
  reference pcVar2;
  reference pbVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  char *s_00;
  char *s_01;
  char *s_02;
  string local_1c8;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  shared_ptr<int> v;
  allocator<char> local_101;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  char *local_f8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  string local_e8 [36];
  uint local_c4;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  char *local_70;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  char name;
  shared_ptr<int> *value_local;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *arg_it_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *it_local;
  parse_flag_short<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_void>
  *this_local;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  arg_last_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last_local;
  
  this_local = (parse_flag_short<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_void>
                *)arg_last._M_current;
  arg_last_local._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)last._M_current;
  pcVar2 = __gnu_cxx::
           __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(it);
  s.field_2._M_local_buf[0xf] = *pcVar2;
  std::__cxx11::string::string((string *)local_60);
  local_70 = it->_M_current;
  local_68 = std::next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(local_70,1);
  bVar1 = __gnu_cxx::operator==
                    (&local_68,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&arg_last_local);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(arg_it);
    bVar1 = __gnu_cxx::operator==
                      (arg_it,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&this_local);
    if (bVar1) {
      widen<std::__cxx11::string>(&local_c0,(detail *)"argument required: -",s_00);
      std::operator+(&local_a0,&local_c0,s.field_2._M_local_buf[0xf]);
      std::__cxx11::string::operator=((string *)err,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      local_c4 = 1;
      goto LAB_001e1429;
    }
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(arg_it);
    std::__cxx11::string::operator=((string *)local_60,(string *)pbVar3);
  }
  else {
    local_f8 = it->_M_current;
    local_f0 = std::next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(local_f8,1)
    ;
    local_100._M_current = (char *)arg_last_local._M_current;
    std::allocator<char>::allocator();
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              (local_e8,local_f0,local_100,&local_101);
    std::__cxx11::string::operator=((string *)local_60,local_e8);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_101);
    v.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg_last_local._M_current;
    _Var4 = std::prev<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )arg_last_local._M_current,1);
    it->_M_current = (char *)_Var4;
  }
  std::
  function<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()((function<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&stack0xfffffffffffffed8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flg->read);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xfffffffffffffed8);
  if (bVar1) {
    std::shared_ptr<int>::operator=(value,(shared_ptr<int> *)&stack0xfffffffffffffed8);
  }
  else {
    widen<std::__cxx11::string>(&local_1a8,(detail *)"invalid argument: -",s_01);
    std::operator+(&local_188,&local_1a8,s.field_2._M_local_buf[0xf]);
    widen<std::__cxx11::string>(&local_1c8,(detail *)0x1ea5f5,s_02);
    std::operator+(&local_168,&local_188,&local_1c8);
    std::operator+(&local_148,&local_168,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    std::__cxx11::string::operator=((string *)err,(string *)&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
  }
  local_c4 = (uint)!bVar1;
  std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)&stack0xfffffffffffffed8);
LAB_001e1429:
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void operator()(
        NameIterator &it, NameIterator last, Iterator &arg_it, Iterator arg_last,
        std::shared_ptr<Value> &value, Flag const &flg, String &err) const
    {
        auto const name = *it;
        String s;
        if (std::next(it) == last) {
            ++arg_it;
            if (arg_it == arg_last) {
                err = widen<String>("argument required: -") + name;
                return;
            }
            s = *arg_it;
        } else {
            s = String(std::next(it), last);
            it = std::prev(last);
        }
        auto const v = flg.read(s);
        if (!v) {
            err = widen<String>("invalid argument: -") + name + widen<String>(" ") + s;
            return;
        }
        value = v;
    }